

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffukyc(fitsfile *fptr,char *keyname,float *value,int decim,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  int *in_R9;
  int tstatus;
  int *in_stack_000000c0;
  char *in_stack_000000c8;
  int in_stack_000000d4;
  float *in_stack_000000d8;
  char *in_stack_000000e0;
  fitsfile *in_stack_000000e8;
  int *in_stack_00000110;
  char *in_stack_00000118;
  int in_stack_00000124;
  float *in_stack_00000128;
  char *in_stack_00000130;
  fitsfile *in_stack_00000138;
  undefined4 local_4;
  
  if (*in_R9 < 1) {
    iVar1 = *in_R9;
    iVar2 = ffmkyc(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124,
                   in_stack_00000118,in_stack_00000110);
    if (iVar2 == 0xca) {
      *in_R9 = iVar1;
      ffpkyc(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
             in_stack_000000c8,in_stack_000000c0);
    }
    local_4 = *in_R9;
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffukyc(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           float *value,       /* I - keyword value      */
           int decim,          /* I - no of decimals     */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkyc(fptr, keyname, value, decim, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkyc(fptr, keyname, value, decim, comm, status);
    }
    return(*status);
}